

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O3

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::convert(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *this,bool aValue,uint8_t param_2,uint8_t param_3)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  undefined3 in_register_00000031;
  
  pcVar3 = "false";
  if (CONCAT31(in_register_00000031,aValue) != 0) {
    pcVar3 = "true";
  }
  cVar1 = *pcVar3;
  pcVar2 = this->mBegin;
  while ((cVar1 != '\0' && (pcVar3 = pcVar3 + 1, pcVar2 < this->mEnd))) {
    *pcVar2 = cVar1;
    pcVar2 = this->mBegin + 1;
    this->mBegin = pcVar2;
    cVar1 = *pcVar3;
  }
  if (pcVar2 < this->mEnd) {
    *pcVar2 = ' ';
    this->mBegin = this->mBegin + 1;
  }
  return;
}

Assistant:

void convert(bool const aValue, uint8_t const, uint8_t const) noexcept {
    append(aValue ? csTrue : csFalse);
    appendSpace();
  }